

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetBindFlagString(Uint32 BindFlag)

{
  bool bVar1;
  Char *pCVar2;
  uint *in_RCX;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  Uint32 BindFlag_local;
  
  msg.field_2._12_4_ = BindFlag;
  if (BindFlag != 0) {
    bVar1 = IsPowerOfTwo<unsigned_int>(BindFlag);
    if (!bVar1) {
      FormatString<char[37]>
                ((string *)local_38,(char (*) [37])"More than one bind flag is specified");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (uint *)0x487;
      DebugAssertionFailed
                (pCVar2,"GetBindFlagString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x487);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  if (msg.field_2._12_4_ == 0) {
    pcStack_10 = "BIND_NONE";
  }
  else if (msg.field_2._12_4_ == 1) {
    pcStack_10 = "BIND_VERTEX_BUFFER";
  }
  else if (msg.field_2._12_4_ == 2) {
    pcStack_10 = "BIND_INDEX_BUFFER";
  }
  else if (msg.field_2._12_4_ == 4) {
    pcStack_10 = "BIND_UNIFORM_BUFFER";
  }
  else if (msg.field_2._12_4_ == 8) {
    pcStack_10 = "BIND_SHADER_RESOURCE";
  }
  else if (msg.field_2._12_4_ == 0x10) {
    pcStack_10 = "BIND_STREAM_OUTPUT";
  }
  else if (msg.field_2._12_4_ == 0x20) {
    pcStack_10 = "BIND_RENDER_TARGET";
  }
  else if (msg.field_2._12_4_ == 0x40) {
    pcStack_10 = "BIND_DEPTH_STENCIL";
  }
  else if (msg.field_2._12_4_ == 0x80) {
    pcStack_10 = "BIND_UNORDERED_ACCESS";
  }
  else if (msg.field_2._12_4_ == 0x100) {
    pcStack_10 = "BIND_INDIRECT_DRAW_ARGS";
  }
  else if (msg.field_2._12_4_ == 0x200) {
    pcStack_10 = "BIND_INPUT_ATTACHMENT";
  }
  else if (msg.field_2._12_4_ == 0x400) {
    pcStack_10 = "BIND_RAY_TRACING";
  }
  else if (msg.field_2._12_4_ == 0x800) {
    pcStack_10 = "BIND_SHADING_RATE";
  }
  else {
    FormatString<char[22],unsigned_int>
              ((string *)local_68,(Diligent *)"Unexpected bind flag ",
               (char (*) [22])((long)&msg.field_2 + 0xc),in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetBindFlagString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x49c);
    std::__cxx11::string::~string((string *)local_68);
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const Char* GetBindFlagString(Uint32 BindFlag)
{
    VERIFY(BindFlag == BIND_NONE || IsPowerOfTwo(BindFlag), "More than one bind flag is specified");

    static_assert(BIND_FLAG_LAST == 0x800L, "Please handle the new bind flag in the switch below");
    switch (BindFlag)
    {
#define BIND_FLAG_STR_CASE(Flag) \
    case Flag: return #Flag;
        BIND_FLAG_STR_CASE(BIND_NONE)
        BIND_FLAG_STR_CASE(BIND_VERTEX_BUFFER)
        BIND_FLAG_STR_CASE(BIND_INDEX_BUFFER)
        BIND_FLAG_STR_CASE(BIND_UNIFORM_BUFFER)
        BIND_FLAG_STR_CASE(BIND_SHADER_RESOURCE)
        BIND_FLAG_STR_CASE(BIND_STREAM_OUTPUT)
        BIND_FLAG_STR_CASE(BIND_RENDER_TARGET)
        BIND_FLAG_STR_CASE(BIND_DEPTH_STENCIL)
        BIND_FLAG_STR_CASE(BIND_UNORDERED_ACCESS)
        BIND_FLAG_STR_CASE(BIND_INDIRECT_DRAW_ARGS)
        BIND_FLAG_STR_CASE(BIND_INPUT_ATTACHMENT)
        BIND_FLAG_STR_CASE(BIND_RAY_TRACING)
        BIND_FLAG_STR_CASE(BIND_SHADING_RATE)
#undef BIND_FLAG_STR_CASE
        default: UNEXPECTED("Unexpected bind flag ", BindFlag); return "";
    }
}